

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

PackageSymbol * __thiscall
slang::ast::findPackage
          (ast *this,string_view packageName,Scope *lookupScope,SourceLocation errorLoc,
          bool isFromExport)

{
  Compilation *this_00;
  PackageSymbol *pPVar1;
  Diagnostic *this_01;
  Scope *pSVar2;
  Scope *this_02;
  DiagCode code;
  string_view lookupName;
  string_view arg;
  
  this_02 = (Scope *)packageName._M_str;
  this_00 = this_02->compilation;
  lookupName._M_str = (char *)packageName._M_len;
  lookupName._M_len = (size_t)this;
  pPVar1 = Compilation::getPackage(this_00,lookupName);
  pSVar2 = this_02;
  if (pPVar1 == (PackageSymbol *)0x0) {
    if ((this != (ast *)0x0) && (((this_00->options).flags.m_bits & 0x40) == 0)) {
      this_01 = Scope::addDiag(this_02,(DiagCode)0xd00006,(SourceLocation)lookupScope);
      arg._M_str = (char *)packageName._M_len;
      arg._M_len = (size_t)this;
      Diagnostic::operator<<(this_01,arg);
    }
LAB_00206823:
    pPVar1 = (PackageSymbol *)0x0;
  }
  else {
    do {
      if (pPVar1 == (PackageSymbol *)pSVar2->thisSym) {
        if (errorLoc._0_1_ == '\0') {
          code.subsystem = Declarations;
          code.code = 0x94;
        }
        else {
          code.subsystem = Declarations;
          code.code = 0x93;
        }
        Scope::addDiag(this_02,code,(SourceLocation)lookupScope);
        goto LAB_00206823;
      }
      pSVar2 = (((PackageSymbol *)pSVar2->thisSym)->super_Symbol).parentScope;
    } while (pSVar2 != (Scope *)0x0);
  }
  return pPVar1;
}

Assistant:

static const PackageSymbol* findPackage(std::string_view packageName, const Scope& lookupScope,
                                        SourceLocation errorLoc, bool isFromExport) {
    auto& comp = lookupScope.getCompilation();
    auto package = comp.getPackage(packageName);
    if (!package) {
        if (!packageName.empty() && !comp.hasFlag(CompilationFlags::LintMode))
            lookupScope.addDiag(diag::UnknownPackage, errorLoc) << packageName;
    }
    else {
        // Make sure we aren't trying to import/export our own package.
        auto currScope = &lookupScope;
        do {
            auto& sym = currScope->asSymbol();
            if (package == &sym) {
                if (isFromExport)
                    lookupScope.addDiag(diag::PackageExportSelf, errorLoc);
                else
                    lookupScope.addDiag(diag::PackageImportSelf, errorLoc);
                return nullptr;
            }

            currScope = sym.getParentScope();
        } while (currScope);
    }

    return package;
}